

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  once_flag *__once;
  LogMessage *other;
  TypeInfo *pTVar4;
  Descriptor *type;
  Message *pMVar5;
  long lVar6;
  long lVar7;
  FieldDescriptor *local_78;
  DynamicMessageFactory *local_70;
  LogMessage local_68;
  
  pTVar4 = this->type_info_;
  if (pTVar4->prototype != (DynamicMessage *)0x0 && pTVar4->prototype != this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
               ,0x240);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: is_prototype(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_78,other);
    internal::LogMessage::~LogMessage(&local_68);
    pTVar4 = this->type_info_;
  }
  pDVar2 = pTVar4->type;
  if (0 < *(int *)(pDVar2 + 0x68)) {
    local_70 = pTVar4->factory;
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar3 = *(long *)(pDVar2 + 0x28);
      uVar1 = (this->type_info_->offsets)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar6];
      __once = *(once_flag **)(lVar3 + 0x30 + lVar7);
      if (__once != (once_flag *)0x0) {
        local_68._0_8_ = FieldDescriptor::TypeOnceInit;
        local_78 = (FieldDescriptor *)(lVar3 + lVar7);
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,(_func_void_FieldDescriptor_ptr **)&local_68,&local_78);
      }
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar3 + 0x38 + lVar7) * 4)
           == 10) && (*(int *)(lVar3 + 0x3c + lVar7) != 3)) {
        type = FieldDescriptor::message_type((FieldDescriptor *)(lVar3 + lVar7));
        pMVar5 = DynamicMessageFactory::GetPrototypeNoLock(local_70,type);
        *(Message **)
         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + (long)(int)uVar1) =
             pMVar5;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x98;
    } while (lVar6 < *(int *)(pDVar2 + 0x68));
  }
  return;
}

Assistant:

inline bool is_prototype() const {
    return type_info_->prototype == this ||
           // If type_info_->prototype is NULL, then we must be constructing
           // the prototype now, which means we must be the prototype.
           type_info_->prototype == NULL;
  }